

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O1

int __thiscall
lodepng::ExtractZlib::HuffmanTree::makeFromLengths
          (HuffmanTree *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *bitlen,
          unsigned_long maxbitlen)

{
  undefined1 *puVar1;
  pointer puVar2;
  pointer puVar3;
  unsigned_long uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  unsigned_long uVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  long lVar13;
  undefined1 *puVar14;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__n;
  bool bVar15;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nextcode;
  vector<unsigned_long,_std::allocator<unsigned_long>_> blcount;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tree1d;
  allocator_type local_99;
  pointer local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_90;
  value_type_conflict2 local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  HuffmanTree *local_38;
  
  local_98 = (bitlen->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
  puVar2 = (bitlen->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar13 = (long)puVar2 - (long)local_98;
  __n = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(lVar13 >> 3);
  local_90 = bitlen;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_50,(size_type)__n,(allocator_type *)&local_68);
  uVar7 = maxbitlen + 1;
  local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_68,uVar7,(value_type_conflict2 *)&local_80,(allocator_type *)&local_88);
  local_88 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_80,uVar7,&local_88,&local_99);
  if (puVar2 != local_98) {
    puVar3 = (local_90->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[puVar3[lVar8]] =
           local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[puVar3[lVar8]] + 1;
      lVar8 = lVar8 + 1;
    } while ((long)&(__n->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                    .super__Vector_impl_data._M_start +
             (ulong)(__n == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) != lVar8);
  }
  if (maxbitlen != 0) {
    uVar6 = 2;
    if (2 < uVar7) {
      uVar6 = uVar7;
    }
    uVar9 = *local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      uVar9 = (uVar9 + local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar8]) * 2;
      local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar8 + 1] = uVar9;
      lVar8 = lVar8 + 1;
    } while (uVar6 - 1 != lVar8);
  }
  if (puVar2 != local_98) {
    puVar3 = (local_90->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      uVar9 = puVar3[lVar8];
      if (uVar9 != 0) {
        uVar4 = local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9];
        local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9] = uVar4 + 1;
        local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar8] = uVar4;
      }
      lVar8 = lVar8 + 1;
    } while ((long)&(__n->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                    .super__Vector_impl_data._M_start +
             (ulong)(__n == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) != lVar8);
  }
  puVar3 = (this->tree2d).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->tree2d).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (this->tree2d).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  local_88 = 0x7fff;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->tree2d,lVar13 >> 2,&local_88);
  bVar15 = puVar2 != local_98;
  local_98._0_1_ = bVar15;
  if (bVar15) {
    puVar2 = (local_90->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_90 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(__n->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start +
               (ulong)(__n == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0));
    puVar1 = (undefined1 *)
             ((long)&__n[-1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 6);
    pvVar10 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    puVar11 = (undefined1 *)0x0;
    puVar12 = (undefined1 *)0x0;
    do {
      uVar7 = puVar2[(long)pvVar10];
      bVar15 = uVar7 != 0;
      if (bVar15) {
        puVar3 = (this->tree2d).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        iVar5 = -1;
        uVar6 = 1;
        puVar14 = puVar12;
        do {
          puVar12 = puVar14;
          if (puVar14 <= puVar1) {
            lVar13 = (long)puVar14 * 2 +
                     (ulong)((local_50.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start[(long)pvVar10] >>
                              ((ulong)(uint)((int)uVar7 + iVar5) & 0x3f) & 1) != 0);
            if (puVar3[lVar13] == 0x7fff) {
              if (uVar6 == uVar7) {
                puVar3[lVar13] = (unsigned_long)pvVar10;
                puVar12 = (undefined1 *)0x0;
              }
              else {
                puVar12 = puVar11 + (long)__n;
                puVar11 = puVar11 + 1;
                puVar3[lVar13] = (unsigned_long)(puVar12 + 1);
                puVar12 = puVar11;
              }
            }
            else {
              puVar12 = (undefined1 *)(puVar3[lVar13] - (long)__n);
            }
          }
          if (puVar1 < puVar14) break;
          uVar7 = puVar2[(long)pvVar10];
          iVar5 = iVar5 + -1;
          bVar15 = uVar6 < uVar7;
          uVar6 = uVar6 + 1;
          puVar14 = puVar12;
        } while (bVar15);
      }
      local_38 = this;
      if (bVar15) break;
      pvVar10 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                ((long)&(pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                        ._M_impl.super__Vector_impl_data._M_start + 1);
      local_98._0_1_ = pvVar10 < __n;
    } while (pvVar10 != local_90);
  }
  if (local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar5 = 0x37;
  if (((byte)local_98 & 1) == 0) {
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int makeFromLengths(const std::vector<unsigned long>& bitlen, unsigned long maxbitlen) { //make tree given the lengths
      unsigned long numcodes = (unsigned long)(bitlen.size()), treepos = 0, nodefilled = 0;
      std::vector<unsigned long> tree1d(numcodes), blcount(maxbitlen + 1, 0), nextcode(maxbitlen + 1, 0);
      //count number of instances of each code length
      for(unsigned long bits = 0; bits < numcodes; bits++) blcount[bitlen[bits]]++;
      for(unsigned long bits = 1; bits <= maxbitlen; bits++) {
        nextcode[bits] = (nextcode[bits - 1] + blcount[bits - 1]) << 1;
      }
      //generate all the codes
      for(unsigned long n = 0; n < numcodes; n++) if(bitlen[n] != 0) tree1d[n] = nextcode[bitlen[n]]++;
      tree2d.clear(); tree2d.resize(numcodes * 2, 32767); //32767 here means the tree2d isn't filled there yet
      for(unsigned long n = 0; n < numcodes; n++) //the codes
      for(unsigned long i = 0; i < bitlen[n]; i++) { //the bits for this code
        unsigned long bit = (tree1d[n] >> (bitlen[n] - i - 1)) & 1;
        if(treepos > numcodes - 2) return 55;
        if(tree2d[2 * treepos + bit] == 32767) { //not yet filled in
          if(i + 1 == bitlen[n]) {
            //last bit
            tree2d[2 * treepos + bit] = n;
            treepos = 0;
          } else {
            //addresses are encoded as values > numcodes
            tree2d[2 * treepos + bit] = ++nodefilled + numcodes;
            treepos = nodefilled;
          }
        }
        else treepos = tree2d[2 * treepos + bit] - numcodes; //subtract numcodes from address to get address value
      }
      return 0;
    }